

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyShader
               (NegativeTestContext *ctx,ShaderType shaderType,string *shaderSource)

{
  ostringstream *this;
  TestLog *log;
  int length;
  char *source;
  Shader shader;
  int local_21c;
  pointer local_218;
  Shader local_210;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_130 [264];
  
  log = (ctx->super_CallLogWrapper).m_log;
  local_218 = (shaderSource->_M_dataplus)._M_p;
  local_21c = (int)shaderSource->_M_string_length;
  glu::Shader::Shader(&local_210,ctx->m_renderCtx,shaderType);
  glu::Shader::setSources(&local_210,1,&local_218,&local_21c);
  glu::Shader::compile(&local_210);
  glu::operator<<(log,&local_210);
  if (local_210.m_info.compileOk == true) {
    this = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Expected shader to fail, but compilation passed.",0x30);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base(local_130);
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Shader was not expected to compile.\n","");
    NegativeTestContext::fail(ctx,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
  }
  glu::Shader::~Shader(&local_210);
  return;
}

Assistant:

void verifyShader (NegativeTestContext& ctx, glu::ShaderType shaderType, std::string shaderSource)
{
	tcu::TestLog&	log		= ctx.getLog();
	const char*		source	= shaderSource.c_str();
	const int		length	= (int) shaderSource.size();
	glu::Shader		shader	(ctx.getRenderContext(), shaderType);

	shader.setSources(1, &source, &length);
	shader.compile();

	log << shader;
	if (shader.getCompileStatus())
	{
		log << tcu::TestLog::Message << "Expected shader to fail, but compilation passed." << tcu::TestLog::EndMessage;
		ctx.fail("Shader was not expected to compile.\n");
	}
}